

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

void __thiscall
flatbuffers::java::JavaGenerator::GenEnum(JavaGenerator *this,EnumDef *enum_def,string *code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  EnumVal *v2;
  int iVar3;
  const_iterator cVar4;
  long *plVar5;
  uint64_t uVar6;
  ulong uVar7;
  EnumVal *pEVar8;
  size_type *psVar9;
  long *plVar10;
  pointer ppEVar11;
  bool bVar12;
  key_type local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  IdlNamer *local_60;
  long *local_58 [2];
  long local_48 [2];
  JavaGenerator *local_38;
  
  if ((enum_def->super_Definition).generated == false) {
    GenComment(&(enum_def->super_Definition).doc_comment,code,
               (CommentConfig *)(anonymous_namespace)::comment_config,"");
    std::__cxx11::string::append((char *)code);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"private","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
                    *)&(enum_def->super_Definition).attributes,&local_a0);
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(enum_def->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header) {
      bVar12 = true;
    }
    else {
      bVar12 = *(long *)(cVar4._M_node + 2) == 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (bVar12) {
      std::__cxx11::string::append((char *)code);
    }
    local_60 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_80,local_60,enum_def);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x36ce64);
    paVar1 = &local_a0.field_2;
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_a0.field_2._M_allocated_capacity = *psVar9;
      local_a0.field_2._8_8_ = plVar5[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar9;
      local_a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_a0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    std::__cxx11::string::append((char *)code);
    (*(local_60->super_Namer)._vptr_Namer[0xf])(local_58,local_60,enum_def);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36440f);
    local_80 = &local_70;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_70 = *plVar10;
      lStack_68 = plVar5[3];
    }
    else {
      local_70 = *plVar10;
      local_80 = (long *)*plVar5;
    }
    local_78 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_a0.field_2._M_allocated_capacity = *psVar9;
      local_a0.field_2._8_8_ = plVar5[3];
      local_a0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.field_2._M_allocated_capacity = *psVar9;
      local_a0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_a0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    ppEVar11 = (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_38 = this;
    if (ppEVar11 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar8 = *ppEVar11;
        GenComment(&pEVar8->doc_comment,code,(CommentConfig *)(anonymous_namespace)::comment_config,
                   "  ");
        std::__cxx11::string::append((char *)code);
        BVar2 = (enum_def->underlying_type).base_type;
        uVar7 = 7;
        if ((((ulong)BVar2 != 4) && (BVar2 != BASE_TYPE_USHORT)) &&
           (uVar7 = (ulong)BVar2, BVar2 == BASE_TYPE_UINT)) {
          uVar7 = 9;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,
                   *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::java_typename +
                             uVar7 * 8),(allocator<char> *)&local_80);
        std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)code);
        (*(local_60->super_Namer)._vptr_Namer[0x13])((allocator<char> *)&local_80,local_60,pEVar8);
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar9 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar9;
          local_a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar9;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        EnumDef::ToString_abi_cxx11_(&local_a0,enum_def,pEVar8);
        std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((enum_def->underlying_type).base_type - BASE_TYPE_LONG < 2) {
          std::__cxx11::string::append((char *)code);
        }
        std::__cxx11::string::append((char *)code);
        ppEVar11 = ppEVar11 + 1;
      } while (ppEVar11 !=
               (enum_def->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    uVar6 = EnumDef::Distance(enum_def);
    if (uVar6 / (ulong)((long)(enum_def->vals).vec.
                              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(enum_def->vals).vec.
                              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) < 5) {
      BVar2 = (enum_def->underlying_type).base_type;
      uVar7 = 7;
      if ((((ulong)BVar2 != 4) && (BVar2 != BASE_TYPE_USHORT)) &&
         (uVar7 = (ulong)BVar2, BVar2 == BASE_TYPE_UINT)) {
        uVar7 = 9;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,
                 *(char **)(GenTypeBasic[abi:cxx11](flatbuffers::Type_const&)::java_typename +
                           uVar7 * 8),(allocator<char> *)&local_80);
      iVar3 = std::__cxx11::string::compare((char *)&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 != 0) {
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        ppEVar11 = (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppEVar11 !=
            (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pEVar8 = *ppEVar11;
          do {
            v2 = *ppEVar11;
            for (uVar7 = EnumDef::Distance(enum_def,pEVar8,v2); 1 < uVar7; uVar7 = uVar7 - 1) {
              std::__cxx11::string::append((char *)code);
            }
            (*(local_60->super_Namer)._vptr_Namer[0x13])(local_58,local_60,v2);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,0x36b884);
            local_80 = &local_70;
            plVar10 = plVar5 + 2;
            if ((long *)*plVar5 == plVar10) {
              local_70 = *plVar10;
              lStack_68 = plVar5[3];
            }
            else {
              local_70 = *plVar10;
              local_80 = (long *)*plVar5;
            }
            local_78 = plVar5[1];
            *plVar5 = (long)plVar10;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            plVar5 = (long *)std::__cxx11::string::append((char *)&local_80);
            psVar9 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_a0.field_2._M_allocated_capacity = *psVar9;
              local_a0.field_2._8_8_ = plVar5[3];
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar9;
              local_a0._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_a0._M_string_length = plVar5[1];
            *plVar5 = (long)psVar9;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
            }
            if (local_80 != &local_70) {
              operator_delete(local_80,local_70 + 1);
            }
            if (local_58[0] != local_48) {
              operator_delete(local_58[0],local_48[0] + 1);
            }
            ppEVar11 = ppEVar11 + 1;
            pEVar8 = v2;
          } while (ppEVar11 !=
                   (enum_def->vals).vec.
                   super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        std::__cxx11::string::append((char *)code);
        pEVar8 = EnumDef::MinValue(enum_def);
        if (pEVar8->value != 0) {
          pEVar8 = EnumDef::MinValue(enum_def);
          (*(local_38->namer_).super_Namer._vptr_Namer[0x14])
                    (&local_80,local_60,pEVar8,
                     (ulong)(local_38->namer_).super_Namer.config_.variants);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,0x367274);
          psVar9 = (size_type *)(plVar5 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_a0.field_2._M_allocated_capacity = *psVar9;
            local_a0.field_2._8_8_ = plVar5[3];
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          }
          else {
            local_a0.field_2._M_allocated_capacity = *psVar9;
            local_a0._M_dataplus._M_p = (pointer)*plVar5;
          }
          local_a0._M_string_length = plVar5[1];
          *plVar5 = (long)psVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code,(ulong)local_a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,local_70 + 1);
          }
        }
        std::__cxx11::string::append((char *)code);
      }
    }
    std::__cxx11::string::append((char *)code);
  }
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string &code) const {
    if (enum_def.generated) return;

    // Generate enum definitions of the form:
    // public static (final) int name = value;
    // In Java, we use ints rather than the Enum feature, because we want them
    // to map directly to how they're used in C/C++ and file formats.
    // That, and Java Enums are expensive, and not universally liked.
    GenComment(enum_def.doc_comment, &code, &comment_config);

    code += "@SuppressWarnings(\"unused\")\n";
    if (enum_def.attributes.Lookup("private")) {
      // For Java, we leave the enum unmarked to indicate package-private
    } else {
      code += "public ";
    }
    code += "final class " + namer_.Type(enum_def);
    code += " {\n";
    code += "  private " + namer_.Type(enum_def) + "() { }\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      GenComment(ev.doc_comment, &code, &comment_config, "  ");
      code += "  public static final ";
      code += GenTypeBasic(DestinationType(enum_def.underlying_type, false));
      code += " ";
      code += namer_.Variant(ev) + " = ";
      code += enum_def.ToString(ev);
      if (enum_def.underlying_type.base_type == BASE_TYPE_LONG ||
          enum_def.underlying_type.base_type == BASE_TYPE_ULONG) {
        code += "L";
      }
      code += ";\n";
    }

    // Generate a string table for enum values.
    // Problem is, if values are very sparse that could generate really big
    // tables. Ideally in that case we generate a map lookup instead, but for
    // the moment we simply don't output a table at all.
    auto range = enum_def.Distance();
    // Average distance between values above which we consider a table
    // "too sparse". Change at will.
    static const uint64_t kMaxSparseness = 5;
    if (range / static_cast<uint64_t>(enum_def.size()) < kMaxSparseness &&
        GenTypeBasic(DestinationType(enum_def.underlying_type, false)) !=
            "long") {
      code += "\n  public static final String";
      code += "[] names = { ";
      const EnumVal *prev = enum_def.Vals().front();
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const EnumVal &ev = **it;
        for (auto k = enum_def.Distance(prev, &ev); k > 1; --k)
          code += "\"\", ";
        prev = &ev;
        code += "\"" + namer_.Variant(ev) + "\", ";
      }
      code += "};\n\n";
      code += "  public static ";
      code += "String";
      code += " name";
      code += "(int e) { return names[e";
      if (enum_def.MinValue()->IsNonZero())
        code += " - " + namer_.Variant(enum_def.MinValue()->name);
      code += "]; }\n";
    }

    // Close the class
    code += "}\n\n";
  }